

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int fire_damage(obj *chain,boolean force,boolean here,xchar x,xchar y)

{
  short sVar1;
  obj *poVar2;
  obj *poVar3;
  obj *obj;
  byte bVar4;
  boolean bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  int local_40;
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    bVar4 = viz_array[y][x] & 1;
  }
  else {
    bVar4 = 0;
  }
  if (chain == (obj *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    do {
      poVar2 = *(obj **)(chain->oextra + (ulong)(here != '\0') * 2 + -0x19);
      bVar5 = catch_lit(chain);
      if (bVar5 == '\0') {
        if ((ushort)(chain->otyp - 0xdaU) < 8) {
          bVar6 = (byte)chain->otyp;
          if (1 < bVar6 - 0xdc) {
            if (bVar6 == 0xdb) {
              uVar16 = 0x28;
            }
            else if (bVar6 == 0xda) {
              uVar16 = 0x1e;
            }
            else {
              uVar16 = 0x14;
            }
            if ((force != '\0') ||
               (iVar8 = (int)u.uluck, iVar13 = (int)u.moreluck, uVar9 = mt_random(),
               iVar8 + iVar13 + 5 <= (int)((ulong)uVar9 % uVar16))) {
              if (bVar4 != 0) {
                pcVar11 = Yname2(chain);
                pline("%s catches fire and burns.",pcVar11);
              }
              if (chain->cobj != (obj *)0x0) {
                if (bVar4 != 0) {
                  pline("Its contents fall out.");
                }
                poVar3 = chain->cobj;
                while (obj = poVar3, obj != (obj *)0x0) {
                  poVar3 = obj->nobj;
                  obj_extract_self(obj);
                  bVar5 = flooreffects(obj,(int)x,(int)y,"");
                  if (bVar5 == '\0') {
                    place_object(obj,level,(int)x,(int)y);
                  }
                }
              }
              delobj(chain);
              local_40 = local_40 + 1;
            }
          }
        }
        else if ((force != '\0') ||
                (iVar8 = (int)u.uluck, iVar13 = (int)u.moreluck, uVar9 = mt_random(),
                iVar8 + iVar13 + 5 <= (int)(uVar9 % 0x14))) {
          bVar6 = chain->oclass;
          if (bVar6 - 9 < 2) {
            sVar1 = chain->otyp;
            if ((sVar1 != 0x162) && (sVar1 != 0x17f)) {
              if (sVar1 != 0x1bd) {
                if (bVar4 != 0) {
                  pcVar12 = Yname2(chain);
                  pcVar11 = destroy_strings
                            [(ulong)((uint)(1 < chain->quan) + (uint)(bVar6 != 9) * 3) + 6];
                  goto LAB_0026abe8;
                }
                goto LAB_0026abf9;
              }
              if (bVar4 != 0) {
                pcVar11 = xname(chain);
                pcVar11 = the(pcVar11);
                pline("Smoke rises from %s.",pcVar11);
              }
            }
          }
          else if (bVar6 == 8) {
            if (bVar4 != 0) {
              pcVar12 = Yname2(chain);
              pcVar11 = destroy_strings[(ulong)(1 < chain->quan) + 3];
LAB_0026abe8:
              pline("%s %s.",pcVar12,pcVar11);
            }
LAB_0026abf9:
            delobj(chain);
            local_40 = local_40 + 1;
          }
          else {
            bVar5 = is_flammable(chain);
            if ((bVar5 != '\0') &&
               (uVar9 = *(uint *)&chain->field_0x4a,
               (uVar9 >> 0xc & 1) == 0 && (~uVar9 & 0x300) != 0)) {
              if ((uVar9 & 2) != 0) {
                uVar9 = mt_random();
                uVar9 = uVar9 & 3;
                lVar14 = (long)u.uluck;
                lVar10 = (long)u.moreluck;
                if (((int)(lVar10 + lVar14) != 0) &&
                   (uVar7 = mt_random(),
                   SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar10 + lVar14)),0) != 0)) {
                  iVar13 = (int)u.moreluck + (int)u.uluck;
                  iVar8 = iVar13 / 3;
                  if (iVar13 < -5) {
                    iVar8 = iVar13;
                  }
                  uVar9 = uVar9 - iVar8;
                  if ((int)uVar9 < 0) {
                    uVar9 = 0;
                  }
                  else if (2 < (int)uVar9) {
                    uVar9 = 3;
                  }
                }
                if (uVar9 == 0) goto LAB_0026a8c4;
              }
              if (bVar4 != 0) {
                pcVar11 = Yname2(chain);
                pcVar12 = otense(chain,"burn");
                uVar9 = *(uint *)&chain->field_0x4a >> 8 & 3;
                pcVar15 = " further";
                if (uVar9 == 0) {
                  pcVar15 = "";
                }
                if (uVar9 == 2) {
                  pcVar15 = " completely";
                }
                pline("%s %s%s.",pcVar11,pcVar12,pcVar15);
              }
              *(uint *)&chain->field_0x4a =
                   *(uint *)&chain->field_0x4a & 0xfffffcff |
                   *(uint *)&chain->field_0x4a + 0x100 & 0x300;
            }
          }
        }
      }
LAB_0026a8c4:
      chain = poVar2;
    } while (poVar2 != (obj *)0x0);
  }
  if (local_40 != 0 && bVar4 == 0) {
    pline("You smell smoke.");
  }
  return local_40;
}

Assistant:

int fire_damage(struct obj *chain, boolean force, boolean here, xchar x, xchar y)
{
    int chance;
    struct obj *obj, *otmp, *nobj, *ncobj;
    int retval = 0;
    int in_sight = !Blind && couldsee(x, y);	/* Don't care if it's lit */
    int dindx;

    for (obj = chain; obj; obj = nobj) {
	nobj = here ? obj->nexthere : obj->nobj;

	/* object might light in a controlled manner */
	if (catch_lit(obj))
	    continue;

	if (Is_container(obj)) {
	    switch (obj->otyp) {
	    case ICE_BOX:
	    case IRON_SAFE:
		continue;		/* Immune */
		/*NOTREACHED*/
		break;
	    case CHEST:
		chance = 40;
		break;
	    case LARGE_BOX:
		chance = 30;
		break;
	    default:
		chance = 20;
		break;
	    }
	    if (!force && (Luck + 5) > rn2(chance))
		continue;
	    /* Container is burnt up - dump contents out */
	    if (in_sight) pline("%s catches fire and burns.", Yname2(obj));
	    if (Has_contents(obj)) {
		if (in_sight) pline("Its contents fall out.");
		for (otmp = obj->cobj; otmp; otmp = ncobj) {
		    ncobj = otmp->nobj;
		    obj_extract_self(otmp);
		    if (!flooreffects(otmp, x, y, ""))
			place_object(otmp, level, x, y);
		}
	    }
	    delobj(obj);
	    retval++;
	} else if (!force && (Luck + 5) > rn2(20)) {
	    /*  chance per item of sustaining damage:
	     *	max luck (full moon):	 5%
	     *	max luck (elsewhen):	10%
	     *	avg luck (Luck==0):	75%
	     *	awful luck (Luck<-4):  100%
	     */
	    continue;
	} else if (obj->oclass == SCROLL_CLASS || obj->oclass == SPBOOK_CLASS) {
	    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
		continue;
	    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		if (in_sight) pline("Smoke rises from %s.", the(xname(obj)));
		continue;
	    }
	    dindx = (obj->oclass == SCROLL_CLASS) ? 2 : 3;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (obj->oclass == POTION_CLASS) {
	    dindx = 1;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (is_flammable(obj) && obj->oeroded < MAX_ERODE &&
		   !(obj->oerodeproof || (obj->blessed && !rnl(4)))) {
	    if (in_sight) {
		pline("%s %s%s.", Yname2(obj), otense(obj, "burn"),
		      obj->oeroded+1 == MAX_ERODE ? " completely" :
		      obj->oeroded ? " further" : "");
	    }
	    obj->oeroded++;
	}
    }

    if (retval && !in_sight)
	pline("You smell smoke.");
    return retval;
}